

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Segment::AddCuePoint(Segment *this,uint64_t timestamp,uint64_t track)

{
  Cluster *pCVar1;
  bool bVar2;
  CuePoint *cue;
  
  if ((long)this->cluster_list_size_ < 1) {
    return false;
  }
  pCVar1 = this->cluster_list_[(long)this->cluster_list_size_ + -1];
  if ((pCVar1 != (Cluster *)0x0) &&
     (cue = (CuePoint *)operator_new(0x28,(nothrow_t *)&std::nothrow), cue != (CuePoint *)0x0)) {
    cue->output_block_number_ = true;
    cue->time_ = timestamp / (this->segment_info_).timecode_scale_;
    cue->block_number_ = (long)pCVar1->blocks_added_;
    cue->cluster_pos_ = pCVar1->position_for_cues_;
    cue->track_ = track;
    bVar2 = Cues::AddCue(&this->cues_,cue);
    if (bVar2) {
      this->new_cuepoint_ = false;
      return true;
    }
    operator_delete(cue);
  }
  return false;
}

Assistant:

bool Segment::AddCuePoint(uint64_t timestamp, uint64_t track) {
  if (cluster_list_size_ < 1)
    return false;

  const Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  CuePoint* const cue = new (std::nothrow) CuePoint();  // NOLINT
  if (!cue)
    return false;

  cue->set_time(timestamp / segment_info_.timecode_scale());
  cue->set_block_number(cluster->blocks_added());
  cue->set_cluster_pos(cluster->position_for_cues());
  cue->set_track(track);
  if (!cues_.AddCue(cue)) {
    delete cue;
    return false;
  }

  new_cuepoint_ = false;
  return true;
}